

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O0

path * __thiscall boost::filesystem::path::operator/=(path *this,path *p)

{
  bool bVar1;
  value_type *pvVar2;
  reference pcVar3;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58 [3];
  undefined1 local_40 [8];
  path rhs;
  path *p_local;
  path *this_local;
  
  rhs.m_pathname.field_2._8_8_ = p;
  bVar1 = empty(p);
  if (!bVar1) {
    if (this == (path *)rhs.m_pathname.field_2._8_8_) {
      path((path *)local_40,(path *)rhs.m_pathname.field_2._8_8_);
      pvVar2 = (value_type *)std::__cxx11::string::operator[]((ulong)local_40);
      bVar1 = anon_unknown.dwarf_f716::is_separator(*pvVar2);
      if (!bVar1) {
        m_append_separator_if_needed(this);
      }
      std::__cxx11::string::operator+=((string *)this,(string *)local_40);
      ~path((path *)local_40);
    }
    else {
      local_58[0]._M_current = (char *)std::__cxx11::string::begin();
      pcVar3 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(local_58);
      bVar1 = anon_unknown.dwarf_f716::is_separator(*pcVar3);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        m_append_separator_if_needed(this);
      }
      std::__cxx11::string::operator+=((string *)this,(string *)rhs.m_pathname.field_2._8_8_);
    }
  }
  return this;
}

Assistant:

path& path::operator/=(const path& p)
  {
    if (p.empty())
      return *this;
    if (this == &p)  // self-append
    {
      path rhs(p);
      if (!is_separator(rhs.m_pathname[0]))
        m_append_separator_if_needed();
      m_pathname += rhs.m_pathname;
    }
    else
    {
      if (!is_separator(*p.m_pathname.begin()))
        m_append_separator_if_needed();
      m_pathname += p.m_pathname;
    }
    return *this;
  }